

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O1

int Extra_ThreshSelectWeights7(word *t,int nVars,int *pW)

{
  int Cost;
  int iVar1;
  int iVar2;
  int iVar3;
  int Cost_1;
  int iVar4;
  int iVar5;
  uint uVar6;
  int i;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  bool bVar15;
  
  uVar6 = 1 << ((byte)nVars & 0x1f);
  if (nVars != 7) {
    __assert_fail("nVars == 7",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/extrab/extraBddThresh.c"
                  ,0x111,"int Extra_ThreshSelectWeights7(word *, int, int *)");
  }
  pW[6] = 1;
  iVar1 = 1;
  do {
    pW[5] = iVar1;
    iVar8 = iVar1;
    do {
      pW[4] = iVar8;
      iVar9 = iVar8;
      do {
        pW[3] = iVar9;
        iVar10 = iVar9;
        do {
          pW[2] = iVar10;
          iVar3 = iVar10;
          do {
            pW[1] = iVar3;
            iVar13 = iVar3;
            do {
              *pW = iVar13;
              iVar14 = iVar13;
              do {
                iVar2 = 10000;
                uVar12 = 0;
                bVar15 = true;
                iVar4 = 0;
                do {
                  uVar11 = (uint)uVar12;
                  lVar7 = 0;
                  if ((t[uVar12 >> 6] >> (uVar12 & 0x3f) & 1) == 0) {
                    iVar5 = 0;
                    do {
                      if ((uVar11 >> ((uint)lVar7 & 0x1f) & 1) != 0) {
                        iVar5 = iVar5 + pW[lVar7];
                      }
                      lVar7 = lVar7 + 1;
                    } while (lVar7 != 7);
                    if (iVar4 <= iVar5) {
                      iVar4 = iVar5;
                    }
                  }
                  else {
                    iVar5 = 0;
                    do {
                      if ((uVar11 >> ((uint)lVar7 & 0x1f) & 1) != 0) {
                        iVar5 = iVar5 + pW[lVar7];
                      }
                      lVar7 = lVar7 + 1;
                    } while (lVar7 != 7);
                    if (iVar5 <= iVar2) {
                      iVar2 = iVar5;
                    }
                  }
                  if (iVar2 <= iVar4) break;
                  uVar11 = uVar11 + 1;
                  uVar12 = (ulong)uVar11;
                  bVar15 = (int)uVar11 < (int)uVar6;
                } while (uVar11 != uVar6);
                if (!bVar15) {
                  if (iVar4 < iVar2) {
                    return iVar2;
                  }
                  __assert_fail("Lmax < Lmin",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/extrab/extraBddThresh.c"
                                ,0x129,"int Extra_ThreshSelectWeights7(word *, int, int *)");
                }
                *pW = iVar14 + 1;
                bVar15 = iVar14 < 0xd;
                iVar14 = iVar14 + 1;
              } while (bVar15);
              pW[1] = iVar13 + 1;
              bVar15 = iVar13 < 0xd;
              iVar13 = iVar13 + 1;
            } while (bVar15);
            pW[2] = iVar3 + 1;
            bVar15 = iVar3 < 0xd;
            iVar3 = iVar3 + 1;
          } while (bVar15);
          pW[3] = iVar10 + 1;
          bVar15 = iVar10 < 0xd;
          iVar10 = iVar10 + 1;
        } while (bVar15);
        pW[4] = iVar9 + 1;
        bVar15 = iVar9 < 0xd;
        iVar9 = iVar9 + 1;
      } while (bVar15);
      pW[5] = iVar8 + 1;
      bVar15 = iVar8 < 0xd;
      iVar8 = iVar8 + 1;
    } while (bVar15);
    pW[6] = iVar1 + 1;
    bVar15 = iVar1 == 0xd;
    iVar1 = iVar1 + 1;
    if (bVar15) {
      return 0;
    }
  } while( true );
}

Assistant:

int Extra_ThreshSelectWeights7(word * t, int nVars, int * pW) {
    int m, Lmin, Lmax, nMints = (1 << nVars), Limit = nVars + 6;
    assert(nVars == 7);
    for (pW[6] = 1; pW[6] <= Limit; pW[6]++)
        for (pW[5] = pW[6]; pW[5] <= Limit; pW[5]++)
            for (pW[4] = pW[5]; pW[4] <= Limit; pW[4]++)
                for (pW[3] = pW[4]; pW[3] <= Limit; pW[3]++)
                    for (pW[2] = pW[3]; pW[2] <= Limit; pW[2]++)
                        for (pW[1] = pW[2]; pW[1] <= Limit; pW[1]++)
                            for (pW[0] = pW[1]; pW[0] <= Limit; pW[0]++) {
                                Lmin = 10000;
                                Lmax = 0;
                                for (m = 0; m < nMints; m++) {
                                    if (Abc_TtGetBit(t, m))
                                        Lmin = Abc_MinInt(Lmin,
                                                Extra_ThreshWeightedSum(pW,
                                                        nVars, m));
                                    else
                                        Lmax = Abc_MaxInt(Lmax,
                                                Extra_ThreshWeightedSum(pW,
                                                        nVars, m));
                                    if (Lmax >= Lmin)
                                        break;
                                }
                                if (m < nMints)
                                    continue;
                                assert(Lmax < Lmin);
                                return Lmin;
                            }
    return 0;
}